

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

bool __thiscall QGraphicsItem::isUnderMouse(QGraphicsItem *this)

{
  QGraphicsItemPrivate *pQVar1;
  QWidget *this_00;
  QGraphicsView **ppQVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QPointF QVar7;
  QPoint cursorPos;
  QPoint local_80;
  QPointF local_78;
  qreal local_68;
  qreal local_60;
  QList<QGraphicsView_*> local_58;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  if (pQVar1->scene == (QGraphicsScene *)0x0) {
    bVar6 = false;
  }
  else {
    local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    local_40 = (QPoint)QCursor::pos();
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (QGraphicsView **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsScene::views(&local_58,(QGraphicsScene *)pQVar1->scene);
    ppQVar2 = local_58.d.ptr;
    bVar6 = (undefined1 *)local_58.d.size != (undefined1 *)0x0;
    if (bVar6) {
      lVar5 = local_58.d.size << 3;
      lVar4 = 0;
      do {
        this_00 = *(QWidget **)((long)ppQVar2 + lVar4);
        local_80 = QWidget::mapFromGlobal(this_00,&local_40);
        QVar7 = QGraphicsView::mapToScene((QGraphicsView *)this_00,&local_80);
        local_78.yp = QVar7.yp;
        local_78.xp = QVar7.xp;
        QVar7 = mapFromScene(this,&local_78);
        local_60 = QVar7.yp;
        local_68 = QVar7.xp;
        iVar3 = (*this->_vptr_QGraphicsItem[5])(this,&local_68);
        if ((char)iVar3 != '\0') break;
        lVar4 = lVar4 + 8;
        bVar6 = lVar5 != lVar4;
      } while (bVar6);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsItem::isUnderMouse() const
{
    Q_D(const QGraphicsItem);
    if (!d->scene)
        return false;

    QPoint cursorPos = QCursor::pos();
    const auto views = d->scene->views();
    for (QGraphicsView *view : views) {
        if (contains(mapFromScene(view->mapToScene(view->mapFromGlobal(cursorPos)))))
            return true;
    }
    return false;
}